

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_statemachine(Curl_easy *data,connectdata *conn)

{
  long lVar1;
  size_t sVar2;
  CURLcode CVar3;
  int iVar4;
  char *pcVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  char *local_88;
  char *store_1;
  char *os;
  char *ptr_1;
  char *store;
  _Bool entry_extracted;
  char *dir;
  size_t buf_size;
  char *ptr;
  size_t nread;
  pingpong *pp;
  ftp_conn *ftpc;
  curl_socket_t local_28;
  int ftpcode;
  curl_socket_t sock;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_28 = conn->sock[0];
  nread = (size_t)&conn->proto;
  ptr = (char *)0x0;
  pp = (pingpong *)nread;
  _sock = conn;
  conn_local = (connectdata *)data;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar3 = Curl_pp_flushsend(data,(pingpong *)nread);
    return CVar3;
  }
  ftpcode = ftp_readresp(data,local_28,(pingpong *)nread,(int *)((long)&ftpc + 4),(size_t *)&ptr);
  if (ftpcode != CURLE_OK) {
    return ftpcode;
  }
  if (ftpc._4_4_ != 0) {
    switch(pp[1].response.tv_usec) {
    case 1:
      if (ftpc._4_4_ == 0xe6) {
        CVar3 = ftp_state_user_resp((Curl_easy *)conn_local,0xe6,pp[1].response.tv_usec);
        return CVar3;
      }
      if (ftpc._4_4_ != 0xdc) {
        Curl_failf((Curl_easy *)conn_local,"Got a %03d ftp-server response when 220 was expected",
                   (ulong)ftpc._4_4_);
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if ((*(int *)((long)conn_local[1].send + 4) == 0) ||
         ((*(ulong *)&(_sock->bits).field_0x4 >> 0x16 & 1) != 0)) {
        ftpcode = ftp_state_user((Curl_easy *)conn_local,_sock);
      }
      else {
        *(undefined4 *)((long)&pp[1].response.tv_sec + 4) = 0;
        if ((uint)conn_local[1].tempsock[1] < 2) {
          *(undefined4 *)&pp[1].response.tv_sec = 1;
          *(undefined4 *)((long)&pp[1].sendsize + 4) = 0;
        }
        else {
          if (conn_local[1].tempsock[1] != 2) {
            Curl_failf((Curl_easy *)conn_local,"unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                       (ulong)(uint)conn_local[1].tempsock[1]);
            return CURLE_UNKNOWN_OPTION;
          }
          *(undefined4 *)&pp[1].response.tv_sec = 0xffffffff;
          *(undefined4 *)((long)&pp[1].sendsize + 4) = 1;
        }
        ftpcode = Curl_pp_sendf((Curl_easy *)conn_local,pp,"AUTH %s",
                                ftp_statemachine::ftpauth + *(int *)((long)&pp[1].sendsize + 4));
        if (ftpcode == CURLE_OK) {
          _state((Curl_easy *)conn_local,FTP_AUTH);
        }
      }
      break;
    case 2:
      if ((ftpc._4_4_ == 0xea) || (ftpc._4_4_ == 0x14e)) {
        ftpcode = Curl_ssl_connect((Curl_easy *)conn_local,_sock,0);
        if (ftpcode == CURLE_OK) {
          *(ulong *)&(_sock->bits).field_0x4 =
               *(ulong *)&(_sock->bits).field_0x4 & 0xffffffffffdfffff;
          *(ulong *)&(_sock->bits).field_0x4 =
               *(ulong *)&(_sock->bits).field_0x4 & 0xffffffffffbfffff | 0x400000;
          ftpcode = ftp_state_user((Curl_easy *)conn_local,_sock);
        }
      }
      else if (*(int *)((long)&pp[1].response.tv_sec + 4) < 1) {
        *(int *)((long)&pp[1].response.tv_sec + 4) = *(int *)((long)&pp[1].response.tv_sec + 4) + 1;
        *(int *)((long)&pp[1].sendsize + 4) =
             (int)pp[1].response.tv_sec + *(int *)((long)&pp[1].sendsize + 4);
        ftpcode = Curl_pp_sendf((Curl_easy *)conn_local,pp,"AUTH %s",
                                ftp_statemachine::ftpauth + *(int *)((long)&pp[1].sendsize + 4));
      }
      else if (*(uint *)((long)conn_local[1].send + 4) < 2) {
        ftpcode = ftp_state_user((Curl_easy *)conn_local,_sock);
      }
      else {
        ftpcode = 0x40;
      }
      break;
    case 3:
    case 4:
      ftpcode = ftp_state_user_resp((Curl_easy *)conn_local,ftpc._4_4_,pp[1].response.tv_usec);
      break;
    case 5:
      ftpcode = ftp_state_acct_resp((Curl_easy *)conn_local,ftpc._4_4_);
      break;
    case 6:
      uVar6 = 0x50;
      if (*(int *)((long)conn_local[1].send + 4) == 2) {
        uVar6 = 0x43;
      }
      ftpcode = Curl_pp_sendf((Curl_easy *)conn_local,pp,"PROT %c",uVar6);
      if (ftpcode == CURLE_OK) {
        _state((Curl_easy *)conn_local,FTP_PROT);
      }
      break;
    case 7:
      if ((int)ftpc._4_4_ / 100 == 2) {
        *(ulong *)&(_sock->bits).field_0x4 =
             *(ulong *)&(_sock->bits).field_0x4 & 0xffffffffffdfffff |
             (ulong)(*(int *)((long)conn_local[1].send + 4) != 2) << 0x15;
      }
      else if (2 < *(uint *)((long)conn_local[1].send + 4)) {
        return CURLE_USE_SSL_FAILED;
      }
      if (conn_local[1].tempfamily[0] == 0) {
        ftpcode = ftp_state_pwd((Curl_easy *)conn_local,_sock);
      }
      else {
        ftpcode = Curl_pp_sendf((Curl_easy *)conn_local,pp,"%s","CCC");
        if (ftpcode == CURLE_OK) {
          _state((Curl_easy *)conn_local,FTP_CCC);
        }
      }
      break;
    case 8:
      if (((int)ftpc._4_4_ < 500) &&
         (ftpcode = Curl_ssl_shutdown((Curl_easy *)conn_local,_sock,0), ftpcode != CURLE_OK)) {
        Curl_failf((Curl_easy *)conn_local,"Failed to clear the command channel (CCC)");
      }
      if (ftpcode == 0) {
        ftpcode = ftp_state_pwd((Curl_easy *)conn_local,_sock);
      }
      break;
    case 9:
      if (ftpc._4_4_ == 0x101) {
        buf_size = (long)&(conn_local[2].ssl[0].backend)->logger + 4;
        lVar1 = *(long *)&conn_local[1].now.tv_usec;
        bVar8 = false;
        pcVar5 = (char *)(*Curl_cmalloc)((size_t)(ptr + 1));
        if (pcVar5 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        while( true ) {
          bVar7 = false;
          if (((buf_size < (ulong)((long)&(conn_local[2].ssl[0].backend)->logger + lVar1)) &&
              (bVar7 = false, *(char *)buf_size != '\n')) &&
             (bVar7 = false, *(char *)buf_size != '\0')) {
            bVar7 = *(char *)buf_size != '\"';
          }
          if (!bVar7) break;
          buf_size = buf_size + 1;
        }
        ptr_1 = pcVar5;
        sVar2 = buf_size;
        if (*(char *)buf_size == '\"') {
          while (buf_size = sVar2 + 1, *(char *)buf_size != '\0') {
            if (*(char *)buf_size == '\"') {
              if (*(char *)(sVar2 + 2) != '\"') {
                bVar8 = true;
                break;
              }
              *ptr_1 = *(char *)(sVar2 + 2);
              buf_size = sVar2 + 2;
            }
            else {
              *ptr_1 = *(char *)buf_size;
            }
            ptr_1 = ptr_1 + 1;
            sVar2 = buf_size;
          }
          *ptr_1 = '\0';
        }
        if (bVar8) {
          if ((pp[1].sendbuf.bufr == (char *)0x0) && (*pcVar5 != '/')) {
            ftpcode = Curl_pp_sendf((Curl_easy *)conn_local,pp,"%s","SYST");
            if (ftpcode == CURLE_OK) {
              (*Curl_cfree)(pp[1].cache);
              pp[1].cache = (char *)0x0;
              pp[1].cache = pcVar5;
              Curl_infof((Curl_easy *)conn_local,"Entry path is \'%s\'",pp[1].cache);
              conn_local[3].http_proxy.passwd = pp[1].cache;
              _state((Curl_easy *)conn_local,FTP_SYST);
              return ftpcode;
            }
            (*Curl_cfree)(pcVar5);
            return ftpcode;
          }
          (*Curl_cfree)(pp[1].cache);
          pp[1].cache = (char *)0x0;
          pp[1].cache = pcVar5;
          Curl_infof((Curl_easy *)conn_local,"Entry path is \'%s\'",pp[1].cache);
          conn_local[3].http_proxy.passwd = pp[1].cache;
        }
        else {
          (*Curl_cfree)(pcVar5);
          Curl_infof((Curl_easy *)conn_local,"Failed to figure out path");
        }
      }
      _state((Curl_easy *)conn_local,FTP_STOP);
      break;
    case 10:
      if (ftpc._4_4_ == 0xd7) {
        os = (char *)((long)&(conn_local[2].ssl[0].backend)->logger + 4);
        pcVar5 = (char *)(*Curl_cmalloc)((size_t)(ptr + 1));
        if (pcVar5 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        for (; local_88 = pcVar5, *os == ' '; os = os + 1) {
        }
        while( true ) {
          bVar8 = false;
          if (*os != '\0') {
            bVar8 = *os != ' ';
          }
          if (!bVar8) break;
          *local_88 = *os;
          local_88 = local_88 + 1;
          os = os + 1;
        }
        *local_88 = '\0';
        iVar4 = Curl_strcasecompare(pcVar5,"OS/400");
        if (iVar4 != 0) {
          ftpcode = Curl_pp_sendf((Curl_easy *)conn_local,pp,"%s","SITE NAMEFMT 1");
          if (ftpcode == CURLE_OK) {
            (*Curl_cfree)(pp[1].sendbuf.bufr);
            pp[1].sendbuf.bufr = (char *)0x0;
            pp[1].sendbuf.bufr = pcVar5;
            _state((Curl_easy *)conn_local,FTP_NAMEFMT);
            return ftpcode;
          }
          (*Curl_cfree)(pcVar5);
          return ftpcode;
        }
        (*Curl_cfree)(pp[1].sendbuf.bufr);
        pp[1].sendbuf.bufr = (char *)0x0;
        pp[1].sendbuf.bufr = pcVar5;
      }
      _state((Curl_easy *)conn_local,FTP_STOP);
      break;
    case 0xb:
      if (ftpc._4_4_ == 0xfa) {
        ftp_state_pwd((Curl_easy *)conn_local,_sock);
      }
      else {
        _state((Curl_easy *)conn_local,FTP_STOP);
      }
      break;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      if (((int)ftpc._4_4_ < 400) || ((int)pp[1].response.tv_sec != 0)) {
        ftpcode = ftp_state_quote((Curl_easy *)conn_local,false,pp[1].response.tv_usec);
      }
      else {
        Curl_failf((Curl_easy *)conn_local,"QUOT command failed with %03d",(ulong)ftpc._4_4_);
        ftpcode = 0x15;
      }
      break;
    case 0x10:
      if ((int)ftpc._4_4_ / 100 == 2) {
        *(undefined4 *)&pp[1].response.tv_sec = 0;
        iVar4 = *(int *)&pp[1].pending_resp + 1;
        *(int *)&pp[1].pending_resp = iVar4;
        if (*(int *)&pp[1].linestart_resp < iVar4) {
          ftpcode = ftp_state_mdtm((Curl_easy *)conn_local);
        }
        else {
          ftpcode = Curl_pp_sendf((Curl_easy *)conn_local,pp,"CWD %s",
                                  *(undefined8 *)
                                   (pp[1].nread_resp + (long)(*(int *)&pp[1].pending_resp + -1) * 8)
                                 );
        }
      }
      else if (((conn_local[1].tempfamily[1] == 0) || (*(int *)&pp[1].pending_resp == 0)) ||
              ((int)pp[1].response.tv_sec != 0)) {
        Curl_failf((Curl_easy *)conn_local,"Server denied you to change to the given directory",
                   (long)(int)ftpc._4_4_ % 100 & 0xffffffff);
        pp[1].field_0x24 = 1;
        ftpcode = 9;
      }
      else {
        *(int *)&pp[1].response.tv_sec = (int)pp[1].response.tv_sec + 1;
        ftpcode = Curl_pp_sendf((Curl_easy *)conn_local,pp,"MKD %s",
                                *(undefined8 *)
                                 (pp[1].nread_resp + (long)(*(int *)&pp[1].pending_resp + -1) * 8));
        if (ftpcode == CURLE_OK) {
          _state((Curl_easy *)conn_local,FTP_MKD);
        }
      }
      break;
    case 0x11:
      if (((int)ftpc._4_4_ / 100 == 2) ||
         (iVar4 = *(int *)((long)&pp[1].response.tv_sec + 4),
         *(int *)((long)&pp[1].response.tv_sec + 4) = iVar4 + -1, iVar4 != 0)) {
        _state((Curl_easy *)conn_local,FTP_CWD);
        ftpcode = Curl_pp_sendf((Curl_easy *)conn_local,pp,"CWD %s",
                                *(undefined8 *)
                                 (pp[1].nread_resp + (long)(*(int *)&pp[1].pending_resp + -1) * 8));
      }
      else {
        Curl_failf((Curl_easy *)conn_local,"Failed to MKD dir: %03d",(ulong)ftpc._4_4_);
        ftpcode = 9;
      }
      break;
    case 0x12:
      ftpcode = ftp_state_mdtm_resp((Curl_easy *)conn_local,ftpc._4_4_);
      break;
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
      ftpcode = ftp_state_type_resp((Curl_easy *)conn_local,ftpc._4_4_,pp[1].response.tv_usec);
      break;
    case 0x17:
    case 0x18:
    case 0x19:
      ftpcode = ftp_state_size_resp((Curl_easy *)conn_local,ftpc._4_4_,pp[1].response.tv_usec);
      break;
    case 0x1a:
    case 0x1b:
      ftpcode = ftp_state_rest_resp((Curl_easy *)conn_local,_sock,ftpc._4_4_,pp[1].response.tv_usec)
      ;
      break;
    case 0x1c:
      ftpcode = ftp_state_port_resp((Curl_easy *)conn_local,ftpc._4_4_);
      break;
    case 0x1d:
      if (ftpc._4_4_ != 200) {
        Curl_failf((Curl_easy *)conn_local,"PRET command not accepted: %03d",(ulong)ftpc._4_4_);
        return CURLE_FTP_PRET_FAILED;
      }
      ftpcode = ftp_state_use_pasv((Curl_easy *)conn_local,_sock);
      break;
    case 0x1e:
      ftpcode = ftp_state_pasv_resp((Curl_easy *)conn_local,ftpc._4_4_);
      break;
    case 0x1f:
    case 0x20:
      ftpcode = ftp_state_get_resp((Curl_easy *)conn_local,ftpc._4_4_,pp[1].response.tv_usec);
      break;
    case 0x21:
      ftpcode = ftp_state_stor_resp((Curl_easy *)conn_local,ftpc._4_4_,pp[1].response.tv_usec);
      break;
    case 0x22:
    default:
      _state((Curl_easy *)conn_local,FTP_STOP);
    }
  }
  return ftpcode;
}

Assistant:

static CURLcode ftp_statemachine(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int ftpcode;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  static const char ftpauth[][4]  = { "SSL", "TLS" };
  size_t nread = 0;

  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  result = ftp_readresp(data, sock, pp, &ftpcode, &nread);
  if(result)
    return result;

  if(ftpcode) {
    /* we have now received a full FTP server response */
    switch(ftpc->state) {
    case FTP_WAIT220:
      if(ftpcode == 230)
        /* 230 User logged in - already! */
        return ftp_state_user_resp(data, ftpcode, ftpc->state);
      else if(ftpcode != 220) {
        failf(data, "Got a %03d ftp-server response when 220 was expected",
              ftpcode);
        return CURLE_WEIRD_SERVER_REPLY;
      }

      /* We have received a 220 response fine, now we proceed. */
#ifdef HAVE_GSSAPI
      if(data->set.krb) {
        /* If not anonymous login, try a secure login. Note that this
           procedure is still BLOCKING. */

        Curl_sec_request_prot(conn, "private");
        /* We set private first as default, in case the line below fails to
           set a valid level */
        Curl_sec_request_prot(conn, data->set.str[STRING_KRB_LEVEL]);

        if(Curl_sec_login(data, conn))
          infof(data, "Logging in with password in cleartext!");
        else
          infof(data, "Authentication successful");
      }
#endif

      if(data->set.use_ssl && !conn->bits.ftp_use_control_ssl) {
        /* We don't have a SSL/TLS control connection yet, but FTPS is
           requested. Try a FTPS connection now */

        ftpc->count3 = 0;
        switch(data->set.ftpsslauth) {
        case CURLFTPAUTH_DEFAULT:
        case CURLFTPAUTH_SSL:
          ftpc->count2 = 1; /* add one to get next */
          ftpc->count1 = 0;
          break;
        case CURLFTPAUTH_TLS:
          ftpc->count2 = -1; /* subtract one to get next */
          ftpc->count1 = 1;
          break;
        default:
          failf(data, "unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                (int)data->set.ftpsslauth);
          return CURLE_UNKNOWN_OPTION; /* we don't know what to do */
        }
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        if(!result)
          state(data, FTP_AUTH);
      }
      else
        result = ftp_state_user(data, conn);
      break;

    case FTP_AUTH:
      /* we have gotten the response to a previous AUTH command */

      /* RFC2228 (page 5) says:
       *
       * If the server is willing to accept the named security mechanism,
       * and does not require any security data, it must respond with
       * reply code 234/334.
       */

      if((ftpcode == 234) || (ftpcode == 334)) {
        /* Curl_ssl_connect is BLOCKING */
        result = Curl_ssl_connect(data, conn, FIRSTSOCKET);
        if(!result) {
          conn->bits.ftp_use_data_ssl = FALSE; /* clear-text data */
          conn->bits.ftp_use_control_ssl = TRUE; /* SSL on control */
          result = ftp_state_user(data, conn);
        }
      }
      else if(ftpc->count3 < 1) {
        ftpc->count3++;
        ftpc->count1 += ftpc->count2; /* get next attempt */
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        /* remain in this same state */
      }
      else {
        if(data->set.use_ssl > CURLUSESSL_TRY)
          /* we failed and CURLUSESSL_CONTROL or CURLUSESSL_ALL is set */
          result = CURLE_USE_SSL_FAILED;
        else
          /* ignore the failure and continue */
          result = ftp_state_user(data, conn);
      }
      break;

    case FTP_USER:
    case FTP_PASS:
      result = ftp_state_user_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_ACCT:
      result = ftp_state_acct_resp(data, ftpcode);
      break;

    case FTP_PBSZ:
      result =
        Curl_pp_sendf(data, &ftpc->pp, "PROT %c",
                      data->set.use_ssl == CURLUSESSL_CONTROL ? 'C' : 'P');
      if(!result)
        state(data, FTP_PROT);
      break;

    case FTP_PROT:
      if(ftpcode/100 == 2)
        /* We have enabled SSL for the data connection! */
        conn->bits.ftp_use_data_ssl =
          (data->set.use_ssl != CURLUSESSL_CONTROL) ? TRUE : FALSE;
      /* FTP servers typically responds with 500 if they decide to reject
         our 'P' request */
      else if(data->set.use_ssl > CURLUSESSL_CONTROL)
        /* we failed and bails out */
        return CURLE_USE_SSL_FAILED;

      if(data->set.ftp_ccc) {
        /* CCC - Clear Command Channel
         */
        result = Curl_pp_sendf(data, &ftpc->pp, "%s", "CCC");
        if(!result)
          state(data, FTP_CCC);
      }
      else
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_CCC:
      if(ftpcode < 500) {
        /* First shut down the SSL layer (note: this call will block) */
        result = Curl_ssl_shutdown(data, conn, FIRSTSOCKET);

        if(result)
          failf(data, "Failed to clear the command channel (CCC)");
      }
      if(!result)
        /* Then continue as normal */
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_PWD:
      if(ftpcode == 257) {
        char *ptr = &data->state.buffer[4];  /* start on the first letter */
        const size_t buf_size = data->set.buffer_size;
        char *dir;
        bool entry_extracted = FALSE;

        dir = malloc(nread + 1);
        if(!dir)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           257<space>[rubbish]"<directory-name>"<space><commentary> and the
           RFC959 says

           The directory name can contain any character; embedded
           double-quotes should be escaped by double-quotes (the
           "quote-doubling" convention).
        */

        /* scan for the first double-quote for non-standard responses */
        while(ptr < &data->state.buffer[buf_size]
              && *ptr != '\n' && *ptr != '\0' && *ptr != '"')
          ptr++;

        if('\"' == *ptr) {
          /* it started good */
          char *store;
          ptr++;
          for(store = dir; *ptr;) {
            if('\"' == *ptr) {
              if('\"' == ptr[1]) {
                /* "quote-doubling" */
                *store = ptr[1];
                ptr++;
              }
              else {
                /* end of path */
                entry_extracted = TRUE;
                break; /* get out of this loop */
              }
            }
            else
              *store = *ptr;
            store++;
            ptr++;
          }
          *store = '\0'; /* null-terminate */
        }
        if(entry_extracted) {
          /* If the path name does not look like an absolute path (i.e.: it
             does not start with a '/'), we probably need some server-dependent
             adjustments. For example, this is the case when connecting to
             an OS400 FTP server: this server supports two name syntaxes,
             the default one being incompatible with standard paths. In
             addition, this server switches automatically to the regular path
             syntax when one is encountered in a command: this results in
             having an entrypath in the wrong syntax when later used in CWD.
               The method used here is to check the server OS: we do it only
             if the path name looks strange to minimize overhead on other
             systems. */

          if(!ftpc->server_os && dir[0] != '/') {
            result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SYST");
            if(result) {
              free(dir);
              return result;
            }
            Curl_safefree(ftpc->entrypath);
            ftpc->entrypath = dir; /* remember this */
            infof(data, "Entry path is '%s'", ftpc->entrypath);
            /* also save it where getinfo can access it: */
            data->state.most_recent_ftp_entrypath = ftpc->entrypath;
            state(data, FTP_SYST);
            break;
          }

          Curl_safefree(ftpc->entrypath);
          ftpc->entrypath = dir; /* remember this */
          infof(data, "Entry path is '%s'", ftpc->entrypath);
          /* also save it where getinfo can access it: */
          data->state.most_recent_ftp_entrypath = ftpc->entrypath;
        }
        else {
          /* couldn't get the path */
          free(dir);
          infof(data, "Failed to figure out path");
        }
      }
      state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_SYST:
      if(ftpcode == 215) {
        char *ptr = &data->state.buffer[4];  /* start on the first letter */
        char *os;
        char *store;

        os = malloc(nread + 1);
        if(!os)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           215<space><OS-name><space><commentary>
        */
        while(*ptr == ' ')
          ptr++;
        for(store = os; *ptr && *ptr != ' ';)
          *store++ = *ptr++;
        *store = '\0'; /* null-terminate */

        /* Check for special servers here. */

        if(strcasecompare(os, "OS/400")) {
          /* Force OS400 name format 1. */
          result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SITE NAMEFMT 1");
          if(result) {
            free(os);
            return result;
          }
          /* remember target server OS */
          Curl_safefree(ftpc->server_os);
          ftpc->server_os = os;
          state(data, FTP_NAMEFMT);
          break;
        }
        /* Nothing special for the target server. */
        /* remember target server OS */
        Curl_safefree(ftpc->server_os);
        ftpc->server_os = os;
      }
      else {
        /* Cannot identify server OS. Continue anyway and cross fingers. */
      }

      state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_NAMEFMT:
      if(ftpcode == 250) {
        /* Name format change successful: reload initial path. */
        ftp_state_pwd(data, conn);
        break;
      }

      state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_QUOTE:
    case FTP_POSTQUOTE:
    case FTP_RETR_PREQUOTE:
    case FTP_STOR_PREQUOTE:
      if((ftpcode >= 400) && !ftpc->count2) {
        /* failure response code, and not allowed to fail */
        failf(data, "QUOT command failed with %03d", ftpcode);
        result = CURLE_QUOTE_ERROR;
      }
      else
        result = ftp_state_quote(data, FALSE, ftpc->state);
      break;

    case FTP_CWD:
      if(ftpcode/100 != 2) {
        /* failure to CWD there */
        if(data->set.ftp_create_missing_dirs &&
           ftpc->cwdcount && !ftpc->count2) {
          /* try making it */
          ftpc->count2++; /* counter to prevent CWD-MKD loops */
          result = Curl_pp_sendf(data, &ftpc->pp, "MKD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
          if(!result)
            state(data, FTP_MKD);
        }
        else {
          /* return failure */
          failf(data, "Server denied you to change to the given directory");
          ftpc->cwdfail = TRUE; /* don't remember this path as we failed
                                   to enter it */
          result = CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      else {
        /* success */
        ftpc->count2 = 0;
        if(++ftpc->cwdcount <= ftpc->dirdepth)
          /* send next CWD */
          result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
        else
          result = ftp_state_mdtm(data);
      }
      break;

    case FTP_MKD:
      if((ftpcode/100 != 2) && !ftpc->count3--) {
        /* failure to MKD the dir */
        failf(data, "Failed to MKD dir: %03d", ftpcode);
        result = CURLE_REMOTE_ACCESS_DENIED;
      }
      else {
        state(data, FTP_CWD);
        /* send CWD */
        result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                               ftpc->dirs[ftpc->cwdcount - 1]);
      }
      break;

    case FTP_MDTM:
      result = ftp_state_mdtm_resp(data, ftpcode);
      break;

    case FTP_TYPE:
    case FTP_LIST_TYPE:
    case FTP_RETR_TYPE:
    case FTP_STOR_TYPE:
      result = ftp_state_type_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_SIZE:
    case FTP_RETR_SIZE:
    case FTP_STOR_SIZE:
      result = ftp_state_size_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_REST:
    case FTP_RETR_REST:
      result = ftp_state_rest_resp(data, conn, ftpcode, ftpc->state);
      break;

    case FTP_PRET:
      if(ftpcode != 200) {
        /* there only is this one standard OK return code. */
        failf(data, "PRET command not accepted: %03d", ftpcode);
        return CURLE_FTP_PRET_FAILED;
      }
      result = ftp_state_use_pasv(data, conn);
      break;

    case FTP_PASV:
      result = ftp_state_pasv_resp(data, ftpcode);
      break;

    case FTP_PORT:
      result = ftp_state_port_resp(data, ftpcode);
      break;

    case FTP_LIST:
    case FTP_RETR:
      result = ftp_state_get_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_STOR:
      result = ftp_state_stor_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(data, FTP_STOP);
      break;
    }
  } /* if(ftpcode) */

  return result;
}